

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateLoopLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  void *pvVar2;
  pointer pcVar3;
  string *psVar4;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var5;
  bool bVar6;
  int iVar7;
  LogMessage *other;
  long *plVar8;
  LayerUnion LVar9;
  iterator iVar10;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *p_Var11;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *p_Var12;
  mapped_type *pmVar13;
  _Base_ptr p_Var14;
  ulong *puVar15;
  size_type *psVar16;
  _Alloc_hider _Var17;
  NeuralNetwork *nn;
  NeuralNetwork *nn_00;
  int iVar18;
  RepeatedField<long> *this_00;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  condition_set;
  Result r;
  string err_4;
  string conditionVar;
  NeuralNetworkSpecValidator bodyNNValidator;
  NeuralNetworkSpecValidator conditionNNValidator;
  undefined1 local_2e8 [8];
  _Alloc_hider local_2e0;
  undefined1 local_2d8 [24];
  _Base_ptr local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2b8;
  _Alloc_hider local_2b0;
  size_type local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *local_290;
  string local_288;
  NeuralNetworkSpecValidator *local_268;
  key_type local_260;
  undefined1 local_240 [8];
  _Alloc_hider local_238;
  undefined1 local_230 [24];
  _Base_ptr local_218;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_208;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  Result *local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  undefined1 local_158 [8];
  _Alloc_hider local_150;
  undefined1 local_148 [40];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_120;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_f0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_b8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  LogMessage local_68;
  
  Result::Result((Result *)&local_2b8);
  validateInputCount((Result *)local_158,layer,0,1);
  local_2b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158;
  std::__cxx11::string::operator=((string *)&local_2b0,(string *)&local_150);
  if (local_150._M_p != local_148 + 8) {
    operator_delete(local_150._M_p,local_148._8_8_ + 1);
  }
  bVar6 = Result::good((Result *)&local_2b8);
  if (bVar6) {
    local_238._M_p = (pointer)0x0;
    local_230._0_8_ = local_230._0_8_ & 0xffffffffffffff00;
    local_240 = (undefined1  [8])local_230;
    Result::Result((Result *)local_158);
    if (local_240 != (undefined1  [8])local_230) {
      operator_delete((void *)local_240,local_230._0_8_ + 1);
    }
    local_2b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158;
    std::__cxx11::string::operator=((string *)&local_2b0,(string *)&local_150);
    if (local_150._M_p != local_148 + 8) {
      operator_delete(local_150._M_p,local_148._8_8_ + 1);
    }
  }
  bVar6 = Result::good((Result *)&local_2b8);
  if (!bVar6) {
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)__return_storage_ptr__ = local_2b8;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_p == &local_2a0) {
      paVar1->_M_allocated_capacity =
           CONCAT71(local_2a0._M_allocated_capacity._1_7_,local_2a0._M_local_buf[0]);
      *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_2a0._8_8_;
    }
    else {
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_2b0._M_p;
      (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
           CONCAT71(local_2a0._M_allocated_capacity._1_7_,local_2a0._M_local_buf[0]);
    }
    (__return_storage_ptr__->m_message)._M_string_length = local_2a8;
    local_2a8 = 0;
    local_2a0._M_local_buf[0] = '\0';
    local_2b0._M_p = (pointer)&local_2a0;
    goto LAB_002e3f0e;
  }
  if ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ != 0) {
    if ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      other = google::protobuf::internal::LogMessage::operator<<
                        (&local_68,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_158,other);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
    }
    pvVar2 = ((layer->inputtensor_).super_RepeatedPtrFieldBase.rep_)->elements[0];
    if ((*(int *)((long)pvVar2 + 0x10) != 0) &&
       (this_00 = (RepeatedField<long> *)((long)pvVar2 + 0x10), 0 < this_00->current_size_)) {
      iVar18 = 0;
      do {
        plVar8 = google::protobuf::RepeatedField<long>::Get(this_00,iVar18);
        if (1 < *plVar8) {
          psVar4 = (layer->name_).ptr_;
          pcVar3 = (psVar4->_M_dataplus)._M_p;
          local_2e8 = (undefined1  [8])local_2d8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_2e8,pcVar3,pcVar3 + psVar4->_M_string_length);
          plVar8 = (long *)std::__cxx11::string::replace((ulong)local_2e8,0,(char *)0x0,0x32a8cd);
          puVar15 = (ulong *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar15) {
            local_230._0_8_ = *puVar15;
            local_230._8_8_ = plVar8[3];
            local_240 = (undefined1  [8])local_230;
          }
          else {
            local_230._0_8_ = *puVar15;
            local_240 = (undefined1  [8])*plVar8;
          }
          local_238._M_p = (pointer)plVar8[1];
          *plVar8 = (long)puVar15;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          plVar8 = (long *)std::__cxx11::string::append(local_240);
          psVar16 = (size_type *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar16) {
            local_148._0_8_ = *psVar16;
            local_148._8_8_ = plVar8[3];
            local_158 = (undefined1  [8])local_148;
          }
          else {
            local_148._0_8_ = *psVar16;
            local_158 = (undefined1  [8])*plVar8;
          }
          local_150._M_p = (pointer)plVar8[1];
          *plVar8 = (long)psVar16;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          if (local_240 != (undefined1  [8])local_230) {
            operator_delete((void *)local_240,local_230._0_8_ + 1);
          }
          if (local_2e8 != (undefined1  [8])local_2d8) {
            operator_delete((void *)local_2e8,local_2d8._0_8_ + 1);
          }
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_158);
          local_260.field_2._M_allocated_capacity = local_148._0_8_;
          _Var17._M_p = (pointer)local_158;
          if (local_158 != (undefined1  [8])local_148) goto LAB_002e3f06;
          goto LAB_002e3f0e;
        }
        iVar18 = iVar18 + 1;
      } while (iVar18 < this_00->current_size_);
    }
  }
  if (layer->_oneof_case_[0] == 0x267) {
    LVar9 = layer->layer_;
  }
  else {
    LVar9.loop_ = Specification::LoopLayerParams::default_instance();
  }
  nn = (NeuralNetwork *)(LVar9.innerproduct_)->bias_;
  if (nn == (NeuralNetwork *)0x0) {
    nn = (NeuralNetwork *)&Specification::_NeuralNetwork_default_instance_;
  }
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  pcVar3 = (((string *)((LVar9.activation_)->NonlinearityType_).linear_)->_M_dataplus)._M_p;
  local_268 = this;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_260,pcVar3,
             pcVar3 + ((string *)((LVar9.activation_)->NonlinearityType_).linear_)->_M_string_length
            );
  nn_00 = (LVar9.loop_)->bodynetwork_;
  if (nn_00 == (NeuralNetwork *)0x0) {
    nn_00 = (NeuralNetwork *)&Specification::_NeuralNetwork_default_instance_;
  }
  if ((nn_00->layers_).super_RepeatedPtrFieldBase.current_size_ == 0) {
    psVar4 = (layer->name_).ptr_;
    pcVar3 = (psVar4->_M_dataplus)._M_p;
    local_2e8 = (undefined1  [8])local_2d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2e8,pcVar3,pcVar3 + psVar4->_M_string_length);
    plVar8 = (long *)std::__cxx11::string::replace((ulong)local_2e8,0,(char *)0x0,0x32a8cd);
    puVar15 = (ulong *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar15) {
      local_230._0_8_ = *puVar15;
      local_230._8_8_ = plVar8[3];
      local_240 = (undefined1  [8])local_230;
    }
    else {
      local_230._0_8_ = *puVar15;
      local_240 = (undefined1  [8])*plVar8;
    }
    local_238._M_p = (pointer)plVar8[1];
    *plVar8 = (long)puVar15;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append(local_240);
    local_158 = (undefined1  [8])local_148;
    psVar16 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_148._0_8_ = *psVar16;
      local_148._8_8_ = plVar8[3];
    }
    else {
      local_148._0_8_ = *psVar16;
      local_158 = (undefined1  [8])*plVar8;
    }
    local_150._M_p = (pointer)plVar8[1];
    *plVar8 = (long)psVar16;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if (local_240 != (undefined1  [8])local_230) {
      operator_delete((void *)local_240,local_230._0_8_ + 1);
    }
    if (local_2e8 != (undefined1  [8])local_2d8) {
      operator_delete((void *)local_2e8,local_2d8._0_8_ + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_158);
LAB_002e3ecc:
    if (local_158 != (undefined1  [8])local_148) {
      operator_delete((void *)local_158,local_148._0_8_ + 1);
    }
  }
  else {
    iVar18 = (nn->layers_).super_RepeatedPtrFieldBase.current_size_;
    iVar7 = std::__cxx11::string::compare((char *)&local_260);
    if (((0 < iVar18) && (iVar7 == 0)) ||
       ((iVar7 = std::__cxx11::string::compare((char *)&local_260), iVar18 < 1 && (iVar7 != 0)))) {
      psVar4 = (layer->name_).ptr_;
      pcVar3 = (psVar4->_M_dataplus)._M_p;
      local_2e8 = (undefined1  [8])local_2d8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2e8,pcVar3,pcVar3 + psVar4->_M_string_length);
      plVar8 = (long *)std::__cxx11::string::replace((ulong)local_2e8,0,(char *)0x0,0x32a8cd);
      puVar15 = (ulong *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar15) {
        local_230._0_8_ = *puVar15;
        local_230._8_8_ = plVar8[3];
        local_240 = (undefined1  [8])local_230;
      }
      else {
        local_230._0_8_ = *puVar15;
        local_240 = (undefined1  [8])*plVar8;
      }
      local_238._M_p = (pointer)plVar8[1];
      *plVar8 = (long)puVar15;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append(local_240);
      local_158 = (undefined1  [8])local_148;
      psVar16 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar16) {
        local_148._0_8_ = *psVar16;
        local_148._8_8_ = plVar8[3];
      }
      else {
        local_148._0_8_ = *psVar16;
        local_158 = (undefined1  [8])*plVar8;
      }
      local_150._M_p = (pointer)plVar8[1];
      *plVar8 = (long)psVar16;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if (local_240 != (undefined1  [8])local_230) {
        operator_delete((void *)local_240,local_230._0_8_ + 1);
      }
      if (local_2e8 != (undefined1  [8])local_2d8) {
        operator_delete((void *)local_2e8,local_2d8._0_8_ + 1);
      }
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_158);
      goto LAB_002e3ecc;
    }
    if (((iVar18 < 1) && ((LVar9.innerproduct_)->outputchannels_ == 0)) &&
       ((layer->input_).super_RepeatedPtrFieldBase.current_size_ == 0)) {
      psVar4 = (layer->name_).ptr_;
      pcVar3 = (psVar4->_M_dataplus)._M_p;
      local_2e8 = (undefined1  [8])local_2d8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2e8,pcVar3,pcVar3 + psVar4->_M_string_length);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240,
                     "Loop Layer \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8)
      ;
      plVar8 = (long *)std::__cxx11::string::append(local_240);
      local_158 = (undefined1  [8])local_148;
      psVar16 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar16) {
        local_148._0_8_ = *psVar16;
        local_148._8_8_ = plVar8[3];
      }
      else {
        local_148._0_8_ = *psVar16;
        local_158 = (undefined1  [8])*plVar8;
      }
      local_150._M_p = (pointer)plVar8[1];
      *plVar8 = (long)psVar16;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if (local_240 != (undefined1  [8])local_230) {
        operator_delete((void *)local_240,local_230._0_8_ + 1);
      }
      if (local_2e8 != (undefined1  [8])local_2d8) {
        operator_delete((void *)local_2e8,local_2d8._0_8_ + 1);
      }
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_158);
      goto LAB_002e3ecc;
    }
    local_290 = &local_268->blobs;
    local_b0 = &local_268->ModelIOBlobNameToRank;
    local_b8 = &local_268->blobNameToRank;
    local_180 = __return_storage_ptr__;
    NeuralNetworkSpecValidator
              ((NeuralNetworkSpecValidator *)local_158,local_290,local_b0,
               local_268->ndArrayInterpretation,local_268->loopStackDepth,local_b8);
    if (iVar18 < 1) {
LAB_002e4521:
      NeuralNetworkSpecValidator
                ((NeuralNetworkSpecValidator *)local_240,local_290,local_b0,
                 local_268->ndArrayInterpretation,local_268->loopStackDepth + 1,local_b8);
      validateNeuralNetwork<CoreML::Specification::NeuralNetwork>
                ((Result *)local_2e8,(NeuralNetworkSpecValidator *)local_240,nn_00);
      __return_storage_ptr__ = local_180;
      local_2b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2e8;
      std::__cxx11::string::operator=((string *)&local_2b0,(string *)&local_2e0);
      if (local_2e0._M_p != local_2d8 + 8) {
        operator_delete(local_2e0._M_p,(ulong)(local_2d8._8_8_ + 1));
      }
      bVar6 = Result::good((Result *)&local_2b8);
      if (bVar6) {
        if (iVar18 < 1) {
          if ((_Rb_tree_header *)local_1d8._M_impl.super__Rb_tree_header._M_header._M_left !=
              &local_1d8._M_impl.super__Rb_tree_header) {
            p_Var14 = local_1d8._M_impl.super__Rb_tree_header._M_header._M_left;
            do {
              local_2e8 = (undefined1  [8])local_2d8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_2e8,*(long *)(p_Var14 + 1),
                         (long)&(p_Var14[1]._M_parent)->_M_color + *(long *)(p_Var14 + 1));
              p_Var12 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                         *)std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                           ::operator[](local_290,(key_type *)local_2e8);
              pmVar13 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                      *)&local_1d8,(key_type *)local_2e8);
              _Var5._M_node = (pmVar13->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              pmVar13 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                      *)&local_1d8,(key_type *)local_2e8);
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
                        (p_Var12,_Var5,
                         (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )&(pmVar13->_M_t)._M_impl.super__Rb_tree_header);
              if (local_2e8 != (undefined1  [8])local_2d8) {
                operator_delete((void *)local_2e8,local_2d8._0_8_ + 1);
              }
              p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
            } while ((_Rb_tree_header *)p_Var14 != &local_1d8._M_impl.super__Rb_tree_header);
          }
        }
        else if ((_Rb_tree_header *)local_f0._M_impl.super__Rb_tree_header._M_header._M_left !=
                 &local_f0._M_impl.super__Rb_tree_header) {
          p_Var14 = local_f0._M_impl.super__Rb_tree_header._M_header._M_left;
          do {
            local_2e8 = (undefined1  [8])local_2d8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_2e8,*(long *)(p_Var14 + 1),
                       (long)&(p_Var14[1]._M_parent)->_M_color + *(long *)(p_Var14 + 1));
            iVar10 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     ::find(&local_1d8,(key_type *)local_2e8);
            if ((_Rb_tree_header *)iVar10._M_node != &local_1d8._M_impl.super__Rb_tree_header) {
              p_Var12 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                         *)std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                           ::operator[](local_290,(key_type *)local_2e8);
              pmVar13 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                      *)&local_1d8,(key_type *)local_2e8);
              _Var5._M_node = (pmVar13->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              pmVar13 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                      *)&local_1d8,(key_type *)local_2e8);
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
                        (p_Var12,_Var5,
                         (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )&(pmVar13->_M_t)._M_impl.super__Rb_tree_header);
            }
            if (local_2e8 != (undefined1  [8])local_2d8) {
              operator_delete((void *)local_2e8,local_2d8._0_8_ + 1);
            }
            p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
          } while ((_Rb_tree_header *)p_Var14 != &local_f0._M_impl.super__Rb_tree_header);
        }
      }
      *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)__return_storage_ptr__ = local_2b8;
      paVar1 = &(__return_storage_ptr__->m_message).field_2;
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_p == &local_2a0) {
        paVar1->_M_allocated_capacity =
             CONCAT71(local_2a0._M_allocated_capacity._1_7_,local_2a0._M_local_buf[0]);
        *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_2a0._8_8_;
      }
      else {
        (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_2b0._M_p;
        (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
             CONCAT71(local_2a0._M_allocated_capacity._1_7_,local_2a0._M_local_buf[0]);
      }
      (__return_storage_ptr__->m_message)._M_string_length = local_2a8;
      local_2a8 = 0;
      local_2a0._M_local_buf[0] = '\0';
      local_2b0._M_p = (pointer)&local_2a0;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~_Rb_tree(&local_1d8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~_Rb_tree(&local_208);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *)&local_238);
    }
    else {
      validateNeuralNetwork<CoreML::Specification::NeuralNetwork>
                ((Result *)local_240,(NeuralNetworkSpecValidator *)local_158,nn);
      local_2b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_240;
      std::__cxx11::string::operator=((string *)&local_2b0,(string *)&local_238);
      __return_storage_ptr__ = local_180;
      if (local_238._M_p != local_230 + 8) {
        operator_delete(local_238._M_p,(ulong)(local_230._8_8_ + 1));
      }
      bVar6 = Result::good((Result *)&local_2b8);
      if (bVar6) {
        iVar10 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::find(&local_290->_M_t,&local_260);
        if ((_Rb_tree_header *)iVar10._M_node ==
            &(local_268->blobs)._M_t._M_impl.super__Rb_tree_header) {
          iVar10 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   ::find(&local_f0,&local_260);
          if ((_Rb_tree_header *)iVar10._M_node == &local_f0._M_impl.super__Rb_tree_header) {
            psVar4 = (layer->name_).ptr_;
            pcVar3 = (psVar4->_M_dataplus)._M_p;
            local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1a0,pcVar3,pcVar3 + psVar4->_M_string_length);
            std::operator+(&local_178,"Loop Layer \'",&local_1a0);
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_178);
            psVar16 = (size_type *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar16) {
              local_288.field_2._M_allocated_capacity = *psVar16;
              local_288.field_2._8_8_ = plVar8[3];
              local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
            }
            else {
              local_288.field_2._M_allocated_capacity = *psVar16;
              local_288._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_288._M_string_length = plVar8[1];
            *plVar8 = (long)psVar16;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2e8,&local_288,&local_260);
            plVar8 = (long *)std::__cxx11::string::append(local_2e8);
            puVar15 = (ulong *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar15) {
              local_230._0_8_ = *puVar15;
              local_230._8_8_ = plVar8[3];
              local_240 = (undefined1  [8])local_230;
            }
            else {
              local_230._0_8_ = *puVar15;
              local_240 = (undefined1  [8])*plVar8;
            }
            local_238._M_p = (pointer)plVar8[1];
            *plVar8 = (long)puVar15;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            if (local_2e8 != (undefined1  [8])local_2d8) {
              operator_delete((void *)local_2e8,local_2d8._0_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_288._M_dataplus._M_p != &local_288.field_2) {
              operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178._M_dataplus._M_p != &local_178.field_2) {
              operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
              operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1
                             );
            }
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_240);
            if (local_240 != (undefined1  [8])local_230) {
              operator_delete((void *)local_240,local_230._0_8_ + 1);
            }
            goto LAB_002e47c4;
          }
        }
        else {
          p_Var11 = &std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     ::operator[](local_290,&local_260)->_M_t;
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_240,p_Var11);
          p_Var11 = &std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                   *)&local_f0,&local_260)->_M_t;
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_2e8,p_Var11);
          if (local_218 == local_2c0) {
            bVar6 = std::__equal<false>::
                    equal<std::_Rb_tree_const_iterator<std::__cxx11::string>,std::_Rb_tree_const_iterator<std::__cxx11::string>>
                              ((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                )local_230._8_8_,(_Base_ptr)&local_238,
                               (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                )local_2d8._8_8_);
          }
          else {
            bVar6 = false;
          }
          if (bVar6 == false) {
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_2e8);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_240);
          }
          else {
            psVar4 = (layer->name_).ptr_;
            pcVar3 = (psVar4->_M_dataplus)._M_p;
            local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_a8,pcVar3,pcVar3 + psVar4->_M_string_length);
            std::operator+(&local_88,"Loop Layer \'",&local_a8);
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_88);
            psVar16 = (size_type *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar16) {
              local_1a0.field_2._M_allocated_capacity = *psVar16;
              local_1a0.field_2._8_8_ = plVar8[3];
              local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
            }
            else {
              local_1a0.field_2._M_allocated_capacity = *psVar16;
              local_1a0._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_1a0._M_string_length = plVar8[1];
            *plVar8 = (long)psVar16;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            std::operator+(&local_178,&local_1a0,&local_260);
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_178);
            psVar16 = (size_type *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar16) {
              local_288.field_2._M_allocated_capacity = *psVar16;
              local_288.field_2._8_8_ = plVar8[3];
              local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
            }
            else {
              local_288.field_2._M_allocated_capacity = *psVar16;
              local_288._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_288._M_string_length = plVar8[1];
            *plVar8 = (long)psVar16;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178._M_dataplus._M_p != &local_178.field_2) {
              operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
              operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != &local_88.field_2) {
              operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
            }
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_288);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_288._M_dataplus._M_p != &local_288.field_2) {
              operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1
                             );
            }
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_2e8);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_240);
            if (bVar6 != false) goto LAB_002e47c4;
          }
        }
        if ((_Rb_tree_header *)local_f0._M_impl.super__Rb_tree_header._M_header._M_left !=
            &local_f0._M_impl.super__Rb_tree_header) {
          p_Var14 = local_f0._M_impl.super__Rb_tree_header._M_header._M_left;
          do {
            local_240 = (undefined1  [8])local_230;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_240,*(long *)(p_Var14 + 1),
                       (long)&(p_Var14[1]._M_parent)->_M_color + *(long *)(p_Var14 + 1));
            p_Var12 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                       *)std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                         ::operator[](local_290,(key_type *)local_240);
            pmVar13 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                    *)&local_f0,(key_type *)local_240);
            _Var5._M_node = (pmVar13->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            pmVar13 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                    *)&local_f0,(key_type *)local_240);
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
                      (p_Var12,_Var5,
                       (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )&(pmVar13->_M_t)._M_impl.super__Rb_tree_header);
            if (local_240 != (undefined1  [8])local_230) {
              operator_delete((void *)local_240,local_230._0_8_ + 1);
            }
            p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
          } while ((_Rb_tree_header *)p_Var14 != &local_f0._M_impl.super__Rb_tree_header);
        }
        goto LAB_002e4521;
      }
      *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)__return_storage_ptr__ = local_2b8;
      paVar1 = &(__return_storage_ptr__->m_message).field_2;
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_p == &local_2a0) {
        paVar1->_M_allocated_capacity =
             CONCAT71(local_2a0._M_allocated_capacity._1_7_,local_2a0._M_local_buf[0]);
        *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_2a0._8_8_;
      }
      else {
        (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_2b0._M_p;
        (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
             CONCAT71(local_2a0._M_allocated_capacity._1_7_,local_2a0._M_local_buf[0]);
      }
      (__return_storage_ptr__->m_message)._M_string_length = local_2a8;
      local_2a8 = 0;
      local_2a0._M_local_buf[0] = '\0';
      local_2b0._M_p = (pointer)&local_2a0;
    }
LAB_002e47c4:
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree(&local_f0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~_Rb_tree(&local_120);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 *)&local_150);
  }
  _Var17._M_p = local_260._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
LAB_002e3f06:
    operator_delete(_Var17._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
LAB_002e3f0e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_p != &local_2a0) {
    operator_delete(local_2b0._M_p,
                    CONCAT71(local_2a0._M_allocated_capacity._1_7_,local_2a0._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateLoopLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 0, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 0, 0);
    }
    if (!r.good()) {
        return r;
    }

    // check that if input exists, and if its shape exists, its scalar
    if (layer.inputtensor_size()) {
        auto &in_tensor = layer.inputtensor(0);
        if (in_tensor.dimvalue_size()) {
            for (int i=0; i < in_tensor.dimvalue_size(); i++) {
                if (in_tensor.dimvalue(i) > 1) {
                    std::string err = "Loop Layer '" + std::string(layer.name()) + "' input's length cannot be more than 1";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }
        }
    }

    const auto& params = layer.loop();
    const auto &conditionNNSpec = params.conditionnetwork();
    std::string conditionVar = params.conditionvar();
    const auto &bodyNNSpec = params.bodynetwork();
    bool isConditionNet = (conditionNNSpec.layers_size() > 0) ? true : false;

    // validate some generic requirements for the existense of fields
    if (bodyNNSpec.layers_size() == 0) {
        std::string err = "Loop Layer '" + std::string(layer.name()) + "' has an empty body network";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if ((conditionVar == "" && isConditionNet) || (conditionVar != "" && !isConditionNet)) {
        std::string err = "Loop Layer '" + std::string(layer.name()) + "': condition variable must be provided if condition network exists and vice versa.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (!isConditionNet && params.maxloopiterations() == 0 && layer.input_size() == 0) {
        std::string err = "Loop Layer '" + std::string(layer.name()) + "': has no input, no condition network and max loop iterations is 0.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }


    NeuralNetworkSpecValidator conditionNNValidator(blobs, ModelIOBlobNameToRank, ndArrayInterpretation, loopStackDepth, blobNameToRank);

    // validate the condition network if it exists
    if (isConditionNet) {
        r = conditionNNValidator.validateNeuralNetwork(conditionNNSpec);
        if (!r.good()) {
            return r;
        }

        // conditionVar must be produced by the condition network
        if (blobs.find(conditionVar) == blobs.end()) { // conditionVar not in the parent NN
            if (conditionNNValidator.blobs.find(conditionVar) == conditionNNValidator.blobs.end()) {
                std::string err = "Loop Layer '" + std::string(layer.name()) + "': has conditionVar named '" + conditionVar + "' which is not produced by the condition network";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            }
        } else { // conditionVar in the parent NN: must be regenerated by the condition network
            std::set<std::string> parent_set = blobs[conditionVar];
            std::set<std::string> condition_set = conditionNNValidator.blobs[conditionVar];
            if (parent_set == condition_set) {
                std::string err = "Loop Layer '" + std::string(layer.name()) + "': has conditionVar named '" + conditionVar + "' which is not produced by the condition network";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            }
        }

        // add the blobs generated by the condition network to the scope of the parent network
        for (auto& blob_map: conditionNNValidator.blobs) {
            std::string current_blob_name = blob_map.first;
            blobs[current_blob_name].insert(conditionNNValidator.blobs[current_blob_name].begin(),
                                            conditionNNValidator.blobs[current_blob_name].end());
        }
    }

    // validate the body network
    NeuralNetworkSpecValidator bodyNNValidator(blobs, ModelIOBlobNameToRank, ndArrayInterpretation, loopStackDepth + 1, blobNameToRank);
    r = bodyNNValidator.validateNeuralNetwork(bodyNNSpec);
    if (!r.good()) {
        return r;
    }

    // update the set of "blobs" of the current Neural Network:
    // - if there is no condition network, all the blobs generated in the body network gets added to the scope of the parent network
    // - if there is a condition network, all its blobs gets added to the overall scope (already done above), as well the ones from the bodynetwork that are present in the condition net.

    if (!isConditionNet) {
        for (auto& blob_map: bodyNNValidator.blobs) {
            std::string current_blob_name = blob_map.first;
            blobs[current_blob_name].insert(bodyNNValidator.blobs[current_blob_name].begin(),
                                            bodyNNValidator.blobs[current_blob_name].end());
        }
    } else {
        for (auto& blob_map: conditionNNValidator.blobs) {
            std::string current_blob_name = blob_map.first;
            if (bodyNNValidator.blobs.find(current_blob_name) != bodyNNValidator.blobs.end()) {
                blobs[current_blob_name].insert(bodyNNValidator.blobs[current_blob_name].begin(),
                                                bodyNNValidator.blobs[current_blob_name].end());
            }
        }
    }

    return r;
}